

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_int(FuncState *fs,int reg,lua_Integer i)

{
  int k;
  
  if (i - 0x10001U < 0xfffffffffffe0000) {
    k = luaK_intK(fs,i);
    luaK_codek(fs,reg,k);
    return;
  }
  codeAsBx(fs,OP_LOADI,reg,(int)i);
  return;
}

Assistant:

void luaK_int (FuncState *fs, int reg, lua_Integer i) {
  if (fitsBx(i))
    codeAsBx(fs, OP_LOADI, reg, cast_int(i));
  else
    luaK_codek(fs, reg, luaK_intK(fs, i));
}